

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>::
createInstance(QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
               *this,Context *context)

{
  BasicOcclusionQueryTestInstance *this_00;
  Context *context_local;
  QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
  *this_local;
  
  this_00 = (BasicOcclusionQueryTestInstance *)operator_new(0x40);
  BasicOcclusionQueryTestInstance::BasicOcclusionQueryTestInstance
            (this_00,context,&this->m_testVector);
  return &this_00->super_TestInstance;
}

Assistant:

vkt::TestInstance* createInstance (vkt::Context& context) const
	{
		return new Instance(context, m_testVector);
	}